

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O1

void __thiscall
soplex::SPxBasisBase<double>::load
          (SPxBasisBase<double> *this,SPxSolverBase<double> *lp,bool initSlackBasis)

{
  DataArray<soplex::SPxBasisBase<double>::Desc::Status> *pDVar1;
  
  this->theLP = lp;
  this->spxout = lp->spxout;
  reDim(this);
  this->minStab = 0.0;
  pDVar1 = &(this->thedesc).rowstat;
  if (this->theLP->theRep == ROW) {
    (this->thedesc).stat = pDVar1;
    pDVar1 = &(this->thedesc).colstat;
  }
  else {
    (this->thedesc).stat = &(this->thedesc).colstat;
  }
  (this->thedesc).costat = pDVar1;
  if (initSlackBasis) {
    restoreInitialBasis(this);
    (*this->_vptr_SPxBasisBase[5])(this,&this->thedesc);
    return;
  }
  return;
}

Assistant:

void SPxBasisBase<R>::load(SPxSolverBase<R>* lp, bool initSlackBasis)
{
   assert(lp != nullptr);
   theLP = lp;

   setOutstream(*theLP->spxout);

   setRep();

   if(initSlackBasis)
   {
      restoreInitialBasis();
      loadDesc(thedesc);
   }
}